

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O3

void re2::SearchNFA(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  bool bVar1;
  undefined4 uVar2;
  Regexp *this;
  Prog *this_00;
  char *local_1b0;
  undefined4 local_1a8 [94];
  size_t sVar3;
  
  if (0 < iters) {
    do {
      uVar2._0_1_ = (ostringstream)0x0;
      uVar2._1_3_ = 0;
      local_1b0 = regexp;
      if (regexp != (char *)0x0) {
        sVar3 = strlen(regexp);
        uVar2 = (undefined4)sVar3;
      }
      local_1a8[0] = uVar2;
      this = Regexp::Parse((StringPiece *)&local_1b0,LikePerl,(RegexpStatus *)0x0);
      if (this == (Regexp *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x380,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Check failed: re",0x10);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      this_00 = Regexp::CompileToProg(this,0);
      if (this_00 == (Prog *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x382,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Check failed: prog",0x12);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      local_1b0 = (char *)0x0;
      local_1a8[0]._0_1_ = (ostringstream)0x0;
      local_1a8[0]._1_3_ = 0;
      bVar1 = Prog::SearchNFA(this_00,text,(StringPiece *)&local_1b0,anchor,kFirstMatch,
                              (StringPiece *)0x0,0);
      if (bVar1 != expect_match) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,900,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Check failed: (prog->SearchNFA(text, __null, anchor, Prog::kFirstMatch, __null, 0)) == (expect_match)"
                   ,0x65);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      Prog::~Prog(this_00);
      operator_delete(this_00);
      Regexp::Decref(this);
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

void SearchNFA(int iters, const char* regexp, const StringPiece& text,
            Prog::Anchor anchor, bool expect_match) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    CHECK_EQ(prog->SearchNFA(text, NULL, anchor, Prog::kFirstMatch, NULL, 0),
             expect_match);
    delete prog;
    re->Decref();
  }
}